

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seismogram.cpp
# Opt level: O0

void __thiscall
CombinedSeismogramm<float,_3>::Save
          (CombinedSeismogramm<float,_3> *this,SeismoType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  float fVar1;
  float fVar2;
  size_type sVar3;
  size_type sVar4;
  ostream *poVar5;
  ulong uVar6;
  reference pvVar7;
  char *pcVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  float local_724;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  ostream local_6c0 [8];
  ofstream outf_expl;
  int local_4bc;
  undefined1 local_4b8 [4];
  int i_3;
  ostream local_498 [8];
  ofstream outf_res;
  int local_294;
  int local_290;
  int j;
  int i_2;
  int i_1;
  ostream local_268 [8];
  ofstream outf;
  uint local_64;
  IndexType path_index;
  float interval;
  allocator<char> local_49;
  string local_48;
  uint local_24;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  IndexType i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paths_local;
  CombinedSeismogramm<float,_3> *pCStack_10;
  SeismoType type_local;
  CombinedSeismogramm<float,_3> *this_local;
  
  pvStack_20 = paths;
  paths_local._4_4_ = type;
  pCStack_10 = this;
  if (type == SEG_Y) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(paths);
    sVar4 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::size
                      (&this->seismogramms);
    if (sVar4 < sVar3) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Too many Seg-Y files to save!");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    for (local_24 = 0; uVar6 = (ulong)local_24,
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(paths), uVar6 < sVar3; local_24 = local_24 + 1) {
      pvVar7 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                         (&this->seismogramms,(ulong)local_24);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](paths,(ulong)local_24);
      pcVar8 = (char *)std::__cxx11::string::data();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,pcVar8,&local_49);
      Seismogramm<float>::SaveSegY(pvVar7,&local_48,&this->times,false);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
    }
  }
  else if (type == CSV) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(paths);
    sVar4 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::size
                      (&this->seismogramms);
    if (sVar4 * 3 < sVar3 * 3) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Too many Csv files to save!");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    pvVar9 = std::vector<float,_std::allocator<float>_>::back(&this->times);
    fVar1 = *pvVar9;
    pvVar9 = std::vector<float,_std::allocator<float>_>::front(&this->times);
    fVar2 = *pvVar9;
    sVar3 = std::vector<float,_std::allocator<float>_>::size(&this->times);
    local_724 = (float)(sVar3 - 1);
    interpolate_data_on_equal_time_intervals
              (this,((fVar1 - fVar2) / local_724) * this->interpolation_multiplier);
    std::vector<float,_std::allocator<float>_>::operator[](&this->times,1);
    std::vector<float,_std::allocator<float>_>::operator[](&this->times,0);
    for (local_64 = 0;
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(paths), local_64 < sVar3; local_64 = local_64 + 1) {
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](paths,(ulong)local_64);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_2,
                     pvVar10,".csv");
      pcVar8 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(local_268,pcVar8,_S_out);
      std::__cxx11::string::~string((string *)&i_2);
      std::operator<<(local_268,"Time;");
      j = 0;
      while( true ) {
        pvVar7 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                           (&this->seismogramms,0);
        sVar3 = std::
                vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ::size(&pvVar7->data);
        if (sVar3 <= (ulong)(long)j) break;
        poVar5 = std::operator<<(local_268,"Vx (edge = ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,j + 1);
        std::operator<<(poVar5,");");
        poVar5 = std::operator<<(local_268,"Vy (edge = ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,j + 1);
        std::operator<<(poVar5,");");
        poVar5 = std::operator<<(local_268,"Vz (edge = ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,j + 1);
        std::operator<<(poVar5,");");
        j = j + 1;
      }
      std::operator<<(local_268,"\n");
      local_290 = 0;
      while( true ) {
        pvVar7 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                           (&this->seismogramms,(ulong)(local_64 * 3));
        pvVar11 = std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::operator[](&pvVar7->data,0);
        sVar3 = std::vector<float,_std::allocator<float>_>::size(pvVar11);
        if (sVar3 <= (ulong)(long)local_290) break;
        pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&this->times,(long)local_290);
        poVar5 = (ostream *)std::ostream::operator<<(local_268,*pvVar9);
        std::operator<<(poVar5,";");
        local_294 = 0;
        while( true ) {
          pvVar7 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                             (&this->seismogramms,(ulong)(local_64 * 3));
          sVar3 = std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::size(&pvVar7->data);
          if (sVar3 <= (ulong)(long)local_294) break;
          pvVar7 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                             (&this->seismogramms,(ulong)(local_64 * 3));
          pvVar11 = std::
                    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ::operator[](&pvVar7->data,(long)local_294);
          pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](pvVar11,(long)local_290);
          poVar5 = (ostream *)std::ostream::operator<<(local_268,*pvVar9);
          std::operator<<(poVar5,";");
          pvVar7 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                             (&this->seismogramms,(ulong)(local_64 * 3 + 1));
          pvVar11 = std::
                    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ::operator[](&pvVar7->data,(long)local_294);
          pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](pvVar11,(long)local_290);
          poVar5 = (ostream *)std::ostream::operator<<(local_268,*pvVar9);
          std::operator<<(poVar5,";");
          pvVar7 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                             (&this->seismogramms,(ulong)(local_64 * 3 + 2));
          pvVar11 = std::
                    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ::operator[](&pvVar7->data,(long)local_294);
          pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](pvVar11,(long)local_290);
          poVar5 = (ostream *)std::ostream::operator<<(local_268,*pvVar9);
          std::operator<<(poVar5,";");
          local_294 = local_294 + 1;
        }
        std::operator<<(local_268,"\n");
        local_290 = local_290 + 1;
      }
      std::ofstream::close();
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](paths,(ulong)local_64);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8,
                     pvVar10,".rec.txt");
      pcVar8 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(local_498,pcVar8,_S_out);
      std::__cxx11::string::~string((string *)local_4b8);
      local_4bc = 0;
      while( true ) {
        pvVar7 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                           (&this->seismogramms,(ulong)(local_64 * 3));
        sVar3 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::size
                          (&pvVar7->trace_header_data);
        if (sVar3 <= (ulong)(long)local_4bc) break;
        pvVar7 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                           (&this->seismogramms,(ulong)(local_64 * 3));
        pvVar12 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::operator[]
                            (&pvVar7->trace_header_data,(long)local_4bc);
        poVar5 = (ostream *)std::ostream::operator<<(local_498,pvVar12->receiver_x);
        poVar5 = std::operator<<(poVar5," ");
        pvVar7 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                           (&this->seismogramms,(ulong)(local_64 * 3));
        pvVar12 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::operator[]
                            (&pvVar7->trace_header_data,(long)local_4bc);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar12->receiver_y);
        std::operator<<(poVar5,"\n");
        local_4bc = local_4bc + 1;
      }
      std::ofstream::close();
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](paths,(ulong)local_64);
      std::operator+(&local_6e0,pvVar10,".expl.txt");
      pcVar8 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(local_6c0,pcVar8,_S_out);
      std::__cxx11::string::~string((string *)&local_6e0);
      pvVar7 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                         (&this->seismogramms,(ulong)(local_64 * 3));
      pvVar12 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::operator[]
                          (&pvVar7->trace_header_data,0);
      poVar5 = (ostream *)std::ostream::operator<<(local_6c0,pvVar12->source_x);
      poVar5 = std::operator<<(poVar5," ");
      pvVar7 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                         (&this->seismogramms,(ulong)(local_64 * 3));
      pvVar12 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::operator[]
                          (&pvVar7->trace_header_data,0);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar12->source_y);
      std::operator<<(poVar5,"\n");
      std::ofstream::close();
      std::ofstream::~ofstream(local_6c0);
      std::ofstream::~ofstream(local_498);
      std::ofstream::~ofstream(local_268);
    }
  }
  return;
}

Assistant:

void CombinedSeismogramm<Scalar, dims>::Save(SeismoType type, std::vector<std::string> paths)
{
    if (type == SEG_Y)
    {
        if (paths.size()> seismogramms.size())
        {
            std::cout << "Too many Seg-Y files to save!" << std::endl;
            std::exit(1);
        }
        for (IndexType i = 0; i < paths.size(); ++i)
        {
            seismogramms[i].SaveSegY(paths[i].data(), times);
        }
    }
    else if (type == CSV)
    {
        if (paths.size() * dims > 3 * seismogramms.size())
        {
            std::cout << "Too many Csv files to save!" << std::endl;
            std::exit(1);
        }

        Scalar interval = (times.back() - times.front()) / (times.size() - 1);
        interpolate_data_on_equal_time_intervals(interval * interpolation_multiplier);
        interval = times[1] - times[0];

        for (IndexType path_index = 0; path_index < paths.size(); path_index++)
        {
            // Saving data
            std::ofstream outf ((paths[path_index] + ".csv").c_str(), std::ios::out);
            outf << "Time;";
            for (int i = 0; i < seismogramms[0].data.size(); i++)
            {
                outf << "Vx (edge = " << i + 1 << ");";
                outf << "Vy (edge = " << i + 1 << ");";
                if (dims >= 3)
                    outf << "Vz (edge = " << i + 1 << ");";
            }
            outf << "\n";
            for (int i = 0; i < seismogramms[dims*path_index].data[0].size(); i++)
            {
                outf << times[i] << ";";
                for (int j = 0; j < seismogramms[dims*path_index].data.size(); j++)
                {
                    outf << seismogramms[dims*path_index + 0].data[j][i] << ";";
                    outf << seismogramms[dims*path_index + 1].data[j][i] << ";";
                    if (dims >= 3)
                        outf << seismogramms[dims*path_index + 2].data[j][i] << ";";
                }
                outf << "\n";
            }
            outf.close();
            // Saving receivers
            std::ofstream outf_res ((paths[path_index] + ".rec.txt").c_str(), std::ios::out);
            for (int i = 0; i < seismogramms[dims*path_index].trace_header_data.size(); i++)
            {
                outf_res << seismogramms[dims*path_index].trace_header_data[i].receiver_x << " " <<
                            seismogramms[dims*path_index].trace_header_data[i].receiver_y << "\n";
            }
            outf_res.close();
            // Saving explosion coords
            std::ofstream outf_expl ((paths[path_index] + ".expl.txt").c_str(), std::ios::out);
            outf_expl << seismogramms[dims*path_index].trace_header_data[0].source_x << " " <<
                         seismogramms[dims*path_index].trace_header_data[0].source_y << "\n";
            outf_expl.close();
        }
    }
}